

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SpecialMatch(Fts5FullTable *pTab,Fts5Cursor *pCsr,char *zQuery)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint local_34;
  char *pcStack_30;
  int n;
  char *z;
  int rc;
  char *zQuery_local;
  Fts5Cursor *pCsr_local;
  Fts5FullTable *pTab_local;
  
  z._4_4_ = 0;
  for (pcStack_30 = zQuery; *pcStack_30 == ' '; pcStack_30 = pcStack_30 + 1) {
  }
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (pcStack_30[(int)local_34] != '\0') {
      bVar3 = pcStack_30[(int)local_34] != ' ';
    }
    if (!bVar3) break;
    local_34 = local_34 + 1;
  }
  pCsr->ePlan = 3;
  iVar1 = sqlite3_strnicmp("reads",pcStack_30,local_34);
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5IndexReads((pTab->p).pIndex);
    pCsr->iSpecial = (long)iVar1;
  }
  else {
    iVar1 = sqlite3_strnicmp("id",pcStack_30,local_34);
    if (iVar1 != 0) {
      pcVar2 = sqlite3_mprintf("unknown special query: %.*s",(ulong)local_34,pcStack_30);
      (pTab->p).base.zErrMsg = pcVar2;
    }
    else {
      pCsr->iSpecial = pCsr->iCsrId;
    }
    z._4_4_ = (uint)(iVar1 != 0);
  }
  return z._4_4_;
}

Assistant:

static int fts5SpecialMatch(
  Fts5FullTable *pTab, 
  Fts5Cursor *pCsr, 
  const char *zQuery
){
  int rc = SQLITE_OK;             /* Return code */
  const char *z = zQuery;         /* Special query text */
  int n;                          /* Number of bytes in text at z */

  while( z[0]==' ' ) z++;
  for(n=0; z[n] && z[n]!=' '; n++);

  assert( pTab->p.base.zErrMsg==0 );
  pCsr->ePlan = FTS5_PLAN_SPECIAL;

  if( 0==sqlite3_strnicmp("reads", z, n) ){
    pCsr->iSpecial = sqlite3Fts5IndexReads(pTab->p.pIndex);
  }
  else if( 0==sqlite3_strnicmp("id", z, n) ){
    pCsr->iSpecial = pCsr->iCsrId;
  }
  else{
    /* An unrecognized directive. Return an error message. */
    pTab->p.base.zErrMsg = sqlite3_mprintf("unknown special query: %.*s", n, z);
    rc = SQLITE_ERROR;
  }

  return rc;
}